

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_type __n;
  ulong uVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = (totals->testCases).passed;
  uVar10 = (totals->testCases).failed + sVar2 + (totals->testCases).failedButOk;
  if (uVar10 == 0) {
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::use(BrightYellow);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_50,0x4f,'=');
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Colour::use(None);
  }
  else {
    sVar3 = (totals->testCases).failed;
    sVar4 = (totals->testCases).failedButOk;
    uVar8 = sVar3 * 0x50;
    uVar6 = uVar8 / uVar10;
    __n = uVar6;
    if (uVar8 < uVar10) {
      __n = 1;
    }
    if (sVar3 == 0) {
      __n = uVar6;
    }
    uVar8 = sVar4 * 0x50;
    uVar7 = uVar8 / uVar10;
    uVar6 = uVar7;
    if (uVar8 < uVar10) {
      uVar6 = 1;
    }
    if (sVar4 == 0) {
      uVar6 = uVar7;
    }
    uVar7 = (sVar2 * 0x50) / uVar10;
    uVar8 = 1;
    if (uVar10 <= sVar2 * 0x50) {
      uVar8 = uVar7;
    }
    if (sVar2 == 0) {
      uVar8 = uVar7;
    }
    uVar10 = uVar6 + __n + uVar8;
    while (uVar10 < 0x4f) {
      uVar7 = uVar8;
      if (uVar8 < uVar6) {
        uVar7 = uVar6;
      }
      if (uVar6 < __n && uVar8 < __n) {
        uVar7 = __n;
      }
      uVar7 = uVar7 + 1;
      uVar9 = uVar7;
      uVar10 = uVar6;
      if (uVar8 < uVar6) {
        uVar9 = uVar8;
        uVar10 = uVar7;
      }
      if (uVar6 >= __n || uVar8 >= __n) {
        uVar7 = __n;
        uVar6 = uVar10;
        uVar8 = uVar9;
      }
      __n = uVar7;
      uVar10 = uVar6 + uVar7 + uVar8;
    }
    uVar10 = uVar6 + __n + uVar8;
    while (0x4f < uVar10) {
      uVar10 = uVar8;
      if (uVar8 < uVar6) {
        uVar10 = uVar6;
      }
      if (uVar6 < __n && uVar8 < __n) {
        uVar10 = __n;
      }
      uVar10 = uVar10 - 1;
      uVar9 = uVar10;
      uVar7 = uVar6;
      if (uVar8 < uVar6) {
        uVar9 = uVar8;
        uVar7 = uVar10;
      }
      if (uVar6 < __n && uVar8 < __n) {
        __n = uVar10;
        uVar7 = uVar6;
        uVar9 = uVar8;
      }
      uVar6 = uVar7;
      uVar8 = uVar9;
      uVar10 = uVar7 + __n + uVar9;
    }
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::use(BrightRed);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_50,__n,'=');
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Colour::use(None);
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::use(BrightYellow);
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_50,uVar6,'=');
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Colour::use(None);
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    if ((totals->testCases).failedButOk == 0 && (totals->testCases).failed == 0) {
      Colour::use(BrightGreen);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_50,uVar8,'=');
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
    else {
      Colour::use(Green);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_50,uVar8,'=');
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
  }
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,(char *)&local_50,1)
  ;
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const &totals) {
    if (totals.testCases.total() > 0) {
      std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
      std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
      std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
      while (failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
        findMax(failedRatio, failedButOkRatio, passedRatio)++;
      while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
        findMax(failedRatio, failedButOkRatio, passedRatio)--;

      stream << Colour(Colour::Error) << std::string(failedRatio, '=');
      stream << Colour(Colour::ResultExpectedFailure) << std::string(failedButOkRatio, '=');
      if (totals.testCases.allPassed())
        stream << Colour(Colour::ResultSuccess) << std::string(passedRatio, '=');
      else
        stream << Colour(Colour::Success) << std::string(passedRatio, '=');
    } else {
      stream << Colour(Colour::Warning) << std::string(CATCH_CONFIG_CONSOLE_WIDTH - 1, '=');
    }
    stream << '\n';
  }